

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall
llvm::yaml::Scanner::Scanner
          (Scanner *this,MemoryBufferRef Buffer,SourceMgr *SM_,bool ShowColors,error_code *EC)

{
  list_type *plVar1;
  SmallVectorImpl<int> *pSVar2;
  SmallVectorImpl<(anonymous_namespace)::SimpleKey> *pSVar3;
  
  this->SM = SM_;
  (this->InputBuffer).Buffer.Data = (char *)0x0;
  (this->InputBuffer).Buffer.Length = 0;
  (this->InputBuffer).Identifier.Data = (char *)0x0;
  (this->InputBuffer).Identifier.Length = 0;
  this->ShowColors = ShowColors;
  (this->TokenQueue).super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>.CurPtr =
       (char *)0x0;
  (this->TokenQueue).super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>.End =
       (char *)0x0;
  (this->TokenQueue).super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>.Slabs.
  super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
  super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX =
       &(this->TokenQueue).super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>.Slabs.
        super_SmallVectorStorage<void_*,_4U>;
  *(undefined8 *)
   ((long)&(this->TokenQueue).super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>.
           Slabs.super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
           super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase + 8) = 0x400000000;
  (this->TokenQueue).super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>.
  CustomSizedSlabs.super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
  super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
  BeginX = &(this->TokenQueue).super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>.
            BytesAllocated;
  *(undefined8 *)
   ((long)&(this->TokenQueue).super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>.
           CustomSizedSlabs.super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
           super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>.
           super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
           super_SmallVectorBase + 8) = 0;
  (this->TokenQueue).super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>.
  BytesAllocated = 0;
  (this->TokenQueue).super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>.RedZoneSize =
       1;
  plVar1 = &(this->TokenQueue).List;
  (this->TokenQueue).List.Sentinel.
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Prev = (ilist_node_base<false> *)0x0;
  (this->TokenQueue).List.Sentinel.
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Next = (ilist_node_base<false> *)0x0;
  (this->TokenQueue).List.Sentinel.
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Prev = (ilist_node_base<false> *)plVar1;
  (this->TokenQueue).List.Sentinel.
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Next = (ilist_node_base<false> *)plVar1;
  (this->Indents).super_SmallVectorImpl<int>.super_SmallVectorTemplateBase<int,_true>.
  super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX =
       &(this->Indents).super_SmallVectorStorage<int,_4U>;
  pSVar2 = &(this->Indents).super_SmallVectorImpl<int>;
  (pSVar2->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
  super_SmallVectorBase.Size = 0;
  (pSVar2->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
  super_SmallVectorBase.Capacity = 4;
  (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
  super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
  super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.
  BeginX = &(this->SimpleKeys).super_SmallVectorStorage<(anonymous_namespace)::SimpleKey,_4U>;
  pSVar3 = &(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>;
  (pSVar3->super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>).
  super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.Size
       = 0;
  (pSVar3->super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>).
  super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.
  Capacity = 4;
  this->EC = EC;
  init(this,(EVP_PKEY_CTX *)SM_);
  return;
}

Assistant:

Scanner::Scanner(MemoryBufferRef Buffer, SourceMgr &SM_, bool ShowColors,
                 std::error_code *EC)
    : SM(SM_), ShowColors(ShowColors), EC(EC) {
  init(Buffer);
}